

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O0

bool Allocations::allocateSubArea
               (int64_t fileID,int64_t *position,int64_t minRange,int64_t maxRange,int64_t size)

{
  int64_t iVar1;
  bool bVar2;
  reference __src;
  int64_t iVar3;
  int64_t extraout_RDX;
  Key key;
  SubArea local_b0;
  long local_a0;
  int64_t offset;
  int64_t possiblePosition;
  int64_t local_88;
  long local_80;
  int64_t actualUsage;
  pair<const_Allocations::Key,_Allocations::Usage> it;
  iterator __end1;
  iterator __begin1;
  map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
  *__range1;
  int64_t size_local;
  int64_t maxRange_local;
  int64_t minRange_local;
  int64_t *position_local;
  int64_t fileID_local;
  
  __end1 = std::
           map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
           ::begin(&allocations);
  it.second._16_8_ =
       std::
       map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
       ::end(&allocations);
  __range1 = (map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
              *)size;
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&it.second.usesFill);
    if (!bVar2) {
      nextKeepPositions = false;
      return false;
    }
    __src = std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::Usage>_>::
            operator*(&__end1);
    memcpy(&actualUsage,__src,0x28);
    iVar1 = it.second.space;
    if ((((actualUsage == fileID) && ((it.second.usage._1_1_ & 1) != 0)) &&
        ((minRange == -1 || (minRange <= it.first.fileID + it.first.position)))) &&
       ((maxRange == -1 || (it.first.fileID <= maxRange)))) {
      possiblePosition = actualUsage;
      local_88 = it.first.fileID;
      key.position = extraout_RDX;
      key.fileID = it.first.fileID;
      iVar3 = getSubAreaUsage((Allocations *)actualUsage,key);
      local_b0.offset = iVar1 + iVar3;
      offset = it.first.fileID + local_b0.offset;
      local_80 = local_b0.offset;
      if (((minRange == -1) || (minRange <= offset)) && ((maxRange == -1 || (offset <= maxRange))))
      {
        if ((((keepPositions & 1U) != 0) &&
            (((*position != -1 && (offset < *position)) &&
             (local_a0 = *position - it.first.fileID, local_a0 + (long)__range1 <= it.first.position
             )))) && (local_a0 != local_b0.offset)) {
          __range1 = (map<Allocations::Key,_Allocations::Usage,_std::less<Allocations::Key>,_std::allocator<std::pair<const_Allocations::Key,_Allocations::Usage>_>_>
                      *)((local_a0 - local_b0.offset) + (long)__range1);
          keptPositions = true;
          offset = *position;
        }
        if ((long)(&(__range1->_M_t)._M_impl.field_0x0 + local_b0.offset) <= it.first.position) {
          *position = offset;
          local_b0.size = (int64_t)__range1;
          std::
          multimap<Allocations::Key,Allocations::SubArea,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::SubArea>>>
          ::emplace<Allocations::Key_const&,Allocations::SubArea>
                    ((multimap<Allocations::Key,Allocations::SubArea,std::less<Allocations::Key>,std::allocator<std::pair<Allocations::Key_const,Allocations::SubArea>>>
                      *)&subAreas,(Key *)&actualUsage,&local_b0);
          return true;
        }
      }
    }
    std::_Rb_tree_iterator<std::pair<const_Allocations::Key,_Allocations::Usage>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

bool Allocations::allocateSubArea(int64_t fileID, int64_t& position, int64_t minRange, int64_t maxRange, int64_t size)
{
	for (auto it : allocations)
	{
		if (it.first.fileID != fileID || !it.second.shared)
			continue;
		if (minRange != -1 && it.first.position + it.second.space < minRange)
			continue;
		if (maxRange != -1 && it.first.position > maxRange)
			continue;

		int64_t actualUsage = it.second.usage + getSubAreaUsage(it.first);
		int64_t possiblePosition = it.first.position + actualUsage;
		if (minRange != -1 && possiblePosition < minRange)
			continue;
		if (maxRange != -1 && possiblePosition > maxRange)
			continue;

		// Can we use the position it had before?  Nudge up size if so.
		if (keepPositions && position != -1 && position > possiblePosition)
		{
			int64_t offset = position - it.first.position;
			if (it.second.space >= offset + size && offset != actualUsage)
			{
				size += offset - actualUsage;
				keptPositions = true;
				// Fall through to reuse the emplace.
				possiblePosition = position;
			}
		}

		if (it.second.space >= actualUsage + size)
		{
			position = possiblePosition;
			subAreas.emplace(it.first, SubArea{ actualUsage, size });
			return true;
		}
	}

	nextKeepPositions = false;
	return false;
}